

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::UnicodeOperator>
               (string_t *ldata,int *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  int iVar4;
  char **ppcVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  anon_union_16_2_67f50693_for_value local_68;
  ValidityMask *local_58;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar5 = &(ldata->value).pointer.ptr;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar5 + -1);
      local_68._0_4_ = paVar1->length;
      local_68._4_1_ = paVar1->prefix[0];
      local_68._5_1_ = paVar1->prefix[1];
      local_68._6_1_ = paVar1->prefix[2];
      local_68._7_1_ = paVar1->prefix[3];
      local_68.pointer.ptr = *ppcVar5;
      iVar4 = UnicodeOperator::Operation<duckdb::string_t,int>((string_t *)&local_68.pointer);
      result_data[iVar7] = iVar4;
      ppcVar5 = ppcVar5 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    local_48 = count + 0x3f >> 6;
    uVar9 = 0;
    local_58 = mask;
    local_50 = count;
    for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar8 = count;
        }
LAB_007cc12a:
        ppcVar5 = &ldata[uVar9].value.pointer.ptr;
        for (; uVar6 = uVar9, uVar9 < uVar8; uVar9 = uVar9 + 1) {
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar5 + -1);
          local_68._0_4_ = paVar1->length;
          local_68._4_1_ = paVar1->prefix[0];
          local_68._5_1_ = paVar1->prefix[1];
          local_68._6_1_ = paVar1->prefix[2];
          local_68._7_1_ = paVar1->prefix[3];
          local_68.pointer.ptr = *ppcVar5;
          iVar4 = UnicodeOperator::Operation<duckdb::string_t,int>((string_t *)&local_68.pointer);
          result_data[uVar9] = iVar4;
          ppcVar5 = ppcVar5 + 2;
        }
      }
      else {
        uVar3 = puVar2[local_40];
        uVar8 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar8 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_007cc12a;
        uVar6 = uVar8;
        if (uVar3 != 0) {
          ppcVar5 = &ldata[uVar9].value.pointer.ptr;
          local_38 = result_data + uVar9;
          for (uVar10 = 0; uVar6 = uVar9 + uVar10, mask = local_58, count = local_50,
              uVar9 + uVar10 < uVar8; uVar10 = uVar10 + 1) {
            if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar5 + -1);
              local_68._0_4_ = paVar1->length;
              local_68._4_1_ = paVar1->prefix[0];
              local_68._5_1_ = paVar1->prefix[1];
              local_68._6_1_ = paVar1->prefix[2];
              local_68._7_1_ = paVar1->prefix[3];
              local_68.pointer.ptr = *ppcVar5;
              iVar4 = UnicodeOperator::Operation<duckdb::string_t,int>
                                ((string_t *)&local_68.pointer);
              local_38[uVar10] = iVar4;
            }
            ppcVar5 = ppcVar5 + 2;
          }
        }
      }
      uVar9 = uVar6;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}